

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O2

size_t __thiscall adios2::core::StructDefinition::Offset(StructDefinition *this,size_t index)

{
  pointer pSVar1;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pSVar1 = (this->m_Definition).
           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_Definition).
                     super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38) <= index) {
    std::__cxx11::string::string((string *)&local_30,"core",&local_91);
    std::__cxx11::string::string((string *)&local_50,"VariableStruct::StructDefinition",&local_92);
    std::__cxx11::string::string((string *)&local_70,"Offset",&local_93);
    std::__cxx11::string::string((string *)&local_90,"invalid index",&local_94);
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    pSVar1 = (this->m_Definition).
             super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  return pSVar1[index].Offset;
}

Assistant:

size_t StructDefinition::Offset(const size_t index) const
{
    if (index >= m_Definition.size())
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "Offset",
                                             "invalid index");
    }
    return m_Definition[index].Offset;
}